

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

void __thiscall
pybind11::class_<ki::protocol::net::Session,_PySession>::class_<>
          (class_<ki::protocol::net::Session,_PySession> *this,handle scope,char *name)

{
  mapped_type ptVar1;
  internals *this_00;
  mapped_type *pptVar2;
  type_record record;
  key_type local_88;
  key_type local_80;
  type_record local_78;
  
  (this->super_generic_type).super_object.super_handle.m_ptr = (PyObject *)0x0;
  detail::type_record::type_record(&local_78);
  local_78.type = (type_info *)&ki::protocol::net::Session::typeinfo;
  local_78.type_size = 0x1d8;
  local_78.holder_size = 8;
  local_78.init_instance = init_instance;
  local_78.dealloc = dealloc;
  local_78._88_1_ = local_78._88_1_ | 8;
  local_78.scope.m_ptr = scope.m_ptr;
  local_78.name = name;
  detail::generic_type::initialize(&this->super_generic_type,&local_78);
  if ((local_78._88_1_ & 0x10) == 0) {
    this_00 = detail::get_internals();
  }
  else {
    this_00 = (internals *)detail::registered_local_types_cpp();
  }
  local_80._M_target = (type_info *)&ki::protocol::net::Session::typeinfo;
  pptVar2 = std::__detail::
            _Map_base<std::type_index,_std::pair<const_std::type_index,_pybind11::detail::type_info_*>,_std::allocator<std::pair<const_std::type_index,_pybind11::detail::type_info_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<std::type_index,_std::pair<const_std::type_index,_pybind11::detail::type_info_*>,_std::allocator<std::pair<const_std::type_index,_pybind11::detail::type_info_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,&local_80);
  ptVar1 = *pptVar2;
  local_88._M_target = (type_info *)&PySession::typeinfo;
  pptVar2 = std::__detail::
            _Map_base<std::type_index,_std::pair<const_std::type_index,_pybind11::detail::type_info_*>,_std::allocator<std::pair<const_std::type_index,_pybind11::detail::type_info_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<std::type_index,_std::pair<const_std::type_index,_pybind11::detail::type_info_*>,_std::allocator<std::pair<const_std::type_index,_pybind11::detail::type_info_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,&local_88);
  *pptVar2 = ptVar1;
  object::~object(&local_78.bases.super_object);
  return;
}

Assistant:

class_(handle scope, const char *name, const Extra &... extra) {
        using namespace detail;

        // MI can only be specified via class_ template options, not constructor parameters
        static_assert(
            none_of<is_pyobject<Extra>...>::value || // no base class arguments, or:
            (   constexpr_sum(is_pyobject<Extra>::value...) == 1 && // Exactly one base
                constexpr_sum(is_base<options>::value...)   == 0 && // no template option bases
                none_of<std::is_same<multiple_inheritance, Extra>...>::value), // no multiple_inheritance attr
            "Error: multiple inheritance bases must be specified via class_ template options");

        type_record record;
        record.scope = scope;
        record.name = name;
        record.type = &typeid(type);
        record.type_size = sizeof(conditional_t<has_alias, type_alias, type>);
        record.holder_size = sizeof(holder_type);
        record.init_instance = init_instance;
        record.dealloc = dealloc;
        record.default_holder = std::is_same<holder_type, std::unique_ptr<type>>::value;

        set_operator_new<type>(&record);

        /* Register base classes specified via template arguments to class_, if any */
        PYBIND11_EXPAND_SIDE_EFFECTS(add_base<options>(record));

        /* Process optional arguments, if any */
        process_attributes<Extra...>::init(extra..., &record);

        generic_type::initialize(record);

        if (has_alias) {
            auto &instances = record.module_local ? registered_local_types_cpp() : get_internals().registered_types_cpp;
            instances[std::type_index(typeid(type_alias))] = instances[std::type_index(typeid(type))];
        }
    }